

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# customwidgetsinfo.cpp
# Opt level: O2

bool __thiscall
CustomWidgetsInfo::extendsOneOf
          (CustomWidgetsInfo *this,QString *classNameIn,QStringList *baseClassNames)

{
  bool bVar1;
  bool bVar2;
  DomCustomWidget *pDVar3;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_68;
  QArrayDataPointer<char16_t> local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = QListSpecialMethods<QString>::contains
                    ((QListSpecialMethods<QString> *)baseClassNames,classNameIn,CaseSensitive);
  bVar2 = true;
  if (!bVar1) {
    local_50.d = (classNameIn->d).d;
    local_50.ptr = (classNameIn->d).ptr;
    local_50.size = (classNameIn->d).size;
    if (local_50.d != (Data *)0x0) {
      LOCK();
      ((local_50.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_50.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    while( true ) {
      pDVar3 = customWidget(this,(QString *)&local_50);
      if (pDVar3 == (DomCustomWidget *)0x0) break;
      local_68.d = (pDVar3->m_extends).d.d;
      local_68.ptr = (pDVar3->m_extends).d.ptr;
      local_68.size = (pDVar3->m_extends).d.size;
      if (local_68.d != (Data *)0x0) {
        LOCK();
        ((local_68.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_68.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      bVar2 = comparesEqual((QString *)&local_50,(QString *)&local_68);
      if (bVar2) {
LAB_001382d6:
        bVar2 = !bVar2;
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
        goto LAB_001382e7;
      }
      bVar1 = QListSpecialMethods<QString>::contains
                        ((QListSpecialMethods<QString> *)baseClassNames,(QString *)&local_68,
                         CaseSensitive);
      if (bVar1) goto LAB_001382d6;
      QString::operator=((QString *)&local_50,(QString *)&local_68);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
    }
    bVar2 = false;
LAB_001382e7:
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool CustomWidgetsInfo::extendsOneOf(const QString &classNameIn,
                                     const QStringList &baseClassNames) const
{
    if (baseClassNames.contains(classNameIn))
        return true;

    QString className = classNameIn;
    while (const DomCustomWidget *c = customWidget(className)) {
        const QString extends = c->elementExtends();
        if (className == extends) // Faulty legacy custom widget entries exist.
            return false;
        if (baseClassNames.contains(extends))
            return true;
        className = extends;
    }
    return false;
}